

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_from_storage(secp256k1_ge *r,secp256k1_ge_storage *a)

{
  secp256k1_fe_from_storage(&r->x,&a->x);
  secp256k1_fe_from_storage(&r->y,&a->y);
  r->infinity = 0;
  secp256k1_ge_verify(r);
  return;
}

Assistant:

static void secp256k1_ge_from_storage(secp256k1_ge *r, const secp256k1_ge_storage *a) {
    secp256k1_fe_from_storage(&r->x, &a->x);
    secp256k1_fe_from_storage(&r->y, &a->y);
    r->infinity = 0;

    SECP256K1_GE_VERIFY(r);
}